

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::AddPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  undefined8 uVar1;
  bool bVar2;
  uchar *puVar3;
  size_type sVar4;
  CfdException *this_00;
  reference this_01;
  ByteData local_110;
  ScriptWitness local_f8;
  ScriptWitness *local_d8;
  ScriptWitness *witness;
  string local_c8;
  CfdSourceLocation local_a8 [2];
  allocator local_61;
  undefined1 local_60 [8];
  string function_name;
  wally_tx_witness_stack *stack_pointer;
  bool is_alloc;
  void *pvStack_30;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  ConfidentialTransaction *pCStack_18;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  tx_pointer = (wally_tx *)data;
  data_local._4_4_ = tx_in_index;
  pCStack_18 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6a8,"AddPeginWitnessStack");
  pvStack_30 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((ulong)data_local._4_4_ < *(ulong *)((long)pvStack_30 + 0x10)) {
    stack_pointer._4_4_ = 0;
    stack_pointer._3_1_ = 0;
    function_name.field_2._8_8_ = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_60,"wally_tx_witness_stack_init_alloc",&local_61)
    ;
    ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (*(long *)(*(long *)((long)pvStack_30 + 8) + (ulong)data_local._4_4_ * 0xd0 + 200) == 0) {
      stack_pointer._3_1_ = 1;
      stack_pointer._4_4_ =
           wally_tx_witness_stack_init_alloc(1,(undefined1 *)((long)&function_name.field_2 + 8));
    }
    else {
      function_name.field_2._8_8_ =
           *(undefined8 *)(*(long *)((long)pvStack_30 + 8) + (ulong)data_local._4_4_ * 0xd0 + 200);
    }
    if (stack_pointer._4_4_ == 0) {
      ::std::__cxx11::string::operator=((string *)local_60,"wally_tx_witness_stack_add");
      bVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
      uVar1 = function_name.field_2._8_8_;
      if (bVar2) {
        stack_pointer._4_4_ = wally_tx_witness_stack_add(function_name.field_2._8_8_,0);
      }
      else {
        puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
        stack_pointer._4_4_ = wally_tx_witness_stack_add(uVar1,puVar3,sVar4);
      }
      if (((stack_pointer._3_1_ & 1) != 0) && (stack_pointer._4_4_ == 0)) {
        *(undefined8 *)(*(long *)((long)pvStack_30 + 8) + (ulong)data_local._4_4_ * 0xd0 + 200) =
             function_name.field_2._8_8_;
        function_name.field_2._8_8_ = 0;
      }
      if (((stack_pointer._3_1_ & 1) != 0) && (function_name.field_2._8_8_ != 0)) {
        wally_tx_witness_stack_free(function_name.field_2._8_8_);
      }
    }
    if (stack_pointer._4_4_ != 0) {
      local_a8[0].filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_a8[0].filename = local_a8[0].filename + 1;
      local_a8[0].line = 0x6d5;
      local_a8[0].funcname = "AddPeginWitnessStack";
      logger::warn<std::__cxx11::string&,int&>
                (local_a8,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 (int *)((long)&stack_pointer + 4));
      witness._6_1_ = 1;
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_c8,"witness stack error.",(allocator *)((long)&witness + 7));
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_c8);
      witness._6_1_ = 0;
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::~string((string *)local_60);
  }
  SetElementsTxState(this);
  this_01 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::operator[](&this->vin_,(ulong)data_local._4_4_);
  ByteData::ByteData(&local_110,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer)
  ;
  ConfidentialTxIn::AddPeginWitnessStack(&local_f8,this_01,&local_110);
  ByteData::~ByteData(&local_110);
  local_d8 = &local_f8;
  ScriptWitness::ScriptWitness(__return_storage_ptr__,local_d8);
  ScriptWitness::~ScriptWitness(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::AddPeginWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].pegin_witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          tx_pointer->inputs[tx_in_index].pegin_witness = stack_pointer;
          stack_pointer = nullptr;
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].AddPeginWitnessStack(ByteData(data));
  return witness;
}